

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  float *pfVar1;
  undefined4 *puVar2;
  XML *this_00;
  long lVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  TransformNode *pTVar7;
  GroupNode *this_01;
  runtime_error *this_02;
  uint uVar8;
  long *in_RDX;
  long lVar9;
  XMLLoader *pXVar10;
  char *pcVar11;
  ulong uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_e8;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  XMLLoader *local_a0;
  Ref<embree::XML> *local_98;
  avector<AffineSpace3ff> local_90;
  string str_time_steps;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_98 = xml;
  std::__cxx11::string::string((string *)&local_e8.field_1,"time_steps",(allocator *)&local_90);
  XML::parm(&str_time_steps,this_00,(string *)&local_e8.field_1);
  std::__cxx11::string::~string((string *)&local_e8.field_1);
  bVar4 = std::operator!=(&str_time_steps,"");
  if (bVar4) {
    uVar6 = std::__cxx11::stoi(&str_time_steps,(size_t *)0x0,10);
    uVar8 = 1;
    if (1 < (int)uVar6) {
      uVar8 = uVar6;
    }
  }
  else {
    uVar8 = 1;
  }
  uVar12 = (ulong)uVar8;
  local_90.size_active = 0;
  local_90.size_alloced = 0;
  local_90.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  local_a0 = this;
  local_90.items =
       (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(uVar12 << 6,0x10);
  lVar9 = 0;
  bVar4 = false;
  local_90.size_active = uVar12;
  local_90.size_alloced = uVar12;
  do {
    lVar3 = *in_RDX;
    if (uVar12 * 8 - lVar9 == 0) {
      if (*(long *)(lVar3 + 0x88) - *(long *)(lVar3 + 0x80) >> 3 == (ulong)(uVar8 + 1)) {
        pTVar7 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
        pXVar10 = local_a0;
        loadNode((XMLLoader *)&local_e8.field_1,local_98);
        SceneGraph::TransformNode::TransformNode
                  (pTVar7,&local_90,(Ref<embree::SceneGraph::Node> *)&local_e8.field_1);
        if ((GroupNode *)local_e8._0_8_ != (GroupNode *)0x0) {
          (**(code **)(*(long *)local_e8._0_8_ + 0x18))();
        }
        (pTVar7->spaces).quaternion = bVar4;
        (pXVar10->path).filename._M_dataplus._M_p = (pointer)pTVar7;
        (**(code **)((long)(pTVar7->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar7);
      }
      else {
        this_01 = (GroupNode *)::operator_new(0x80);
        pXVar10 = local_a0;
        SceneGraph::GroupNode::GroupNode(this_01,0);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        for (; uVar12 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3);
            uVar12 = uVar12 + 1) {
          loadNode((XMLLoader *)&local_e8.field_1,local_98);
          SceneGraph::GroupNode::add(this_01,(Ref<embree::SceneGraph::Node> *)&local_e8.field_1);
          if ((GroupNode *)local_e8._0_8_ != (GroupNode *)0x0) {
            (**(code **)(*(long *)local_e8._0_8_ + 0x18))();
          }
        }
        pTVar7 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
        local_e8._0_8_ = this_01;
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        SceneGraph::TransformNode::TransformNode
                  (pTVar7,&local_90,(Ref<embree::SceneGraph::Node> *)&local_e8.field_1);
        if ((GroupNode *)local_e8._0_8_ != (GroupNode *)0x0) {
          (**(code **)(*(long *)local_e8._0_8_ + 0x18))();
        }
        (pTVar7->spaces).quaternion = bVar4;
        (pXVar10->path).filename._M_dataplus._M_p = (pointer)pTVar7;
        (**(code **)((long)(pTVar7->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar7);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
      }
      alignedFree(local_90.items);
      std::__cxx11::string::~string((string *)&str_time_steps);
      return (Ref<embree::SceneGraph::Node>)(Node *)pXVar10;
    }
    pcVar11 = "AffineSpace";
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(*(long *)(lVar3 + 0x80) + lVar9) + 0x30),"AffineSpace");
    if (bVar5) {
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                ((AffineSpace3fa *)&local_e8.field_1,(XMLLoader *)pcVar11,
                 (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar9));
    }
    else {
      pcVar11 = "Quaternion";
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)(*(long *)(*in_RDX + 0x80) + lVar9) + 0x30),"Quaternion");
      if (!bVar4) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8.field_1,&local_50,": unknown transformation representation");
        std::runtime_error::runtime_error(this_02,(string *)&local_e8.field_1);
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadQuaternion((AffineSpace3ff *)&local_e8.field_1,(XMLLoader *)pcVar11,
                     (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar9));
      bVar4 = true;
    }
    pfVar1 = (float *)((long)&((local_90.items)->l).vx.field_0 + lVar9 * 8);
    *pfVar1 = local_e8.m128[0];
    pfVar1[1] = local_e8.m128[1];
    pfVar1[2] = local_e8.m128[2];
    pfVar1[3] = local_e8.m128[3];
    puVar2 = (undefined4 *)((long)&((local_90.items)->l).vy.field_0 + lVar9 * 8);
    *puVar2 = local_d8;
    puVar2[1] = uStack_d4;
    puVar2[2] = uStack_d0;
    puVar2[3] = uStack_cc;
    puVar2 = (undefined4 *)((long)&((local_90.items)->l).vz.field_0 + lVar9 * 8);
    *puVar2 = local_c8;
    puVar2[1] = uStack_c4;
    puVar2[2] = uStack_c0;
    puVar2[3] = uStack_bc;
    puVar2 = (undefined4 *)((long)&((local_90.items)->p).field_0 + lVar9 * 8);
    *puVar2 = local_b8;
    puVar2[1] = uStack_b4;
    puVar2[2] = uStack_b0;
    puVar2[3] = uStack_ac;
    lVar9 = lVar9 + 8;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    AffineSpace3ff space;
    avector<AffineSpace3ff> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      AffineSpace3ff space;
      if (xml->children[i]->name == "AffineSpace") {
        space = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
        spaces[j++] = space;
      }
      else if (xml->children[i]->name == "Quaternion") {
        space = loadQuaternion(xml->children[i]);
        quaternion = true;
        spaces[j++] = space;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);
    
    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::TransformNode(spaces,loadNode(xml->children[time_steps]));
      node->spaces.quaternion = quaternion;
      return node;
    }
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));
    
    auto node = new  SceneGraph::TransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    node->spaces.quaternion = quaternion;
    return node;
  }